

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall CGraphics_Threaded::QuadsBegin(CGraphics_Threaded *this)

{
  int iVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0x1fd,(uint)(this->m_Drawing == 0),"called Graphics()->QuadsBegin twice");
  this->m_Drawing = 1;
  (**(code **)(*(long *)this + 0xd0))(0,0,0x3f800000,0x3f800000,this,0xffffffffffffffff);
  (**(code **)(*(long *)this + 200))(0,this);
  (**(code **)(*(long *)this + 0x108))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,this);
  iVar1 = (*this->m_pBackend->_vptr_IGraphicsBackend[5])();
  this->m_TextureArrayIndex = -(uint)(1 < iVar1);
  return;
}

Assistant:

void CGraphics_Threaded::QuadsBegin()
{
	dbg_assert(m_Drawing == 0, "called Graphics()->QuadsBegin twice");
	m_Drawing = DRAWING_QUADS;

	QuadsSetSubset(0,0,1,1,-1);
	QuadsSetRotation(0);
	SetColor(1,1,1,1);
	m_TextureArrayIndex = m_pBackend->GetTextureArraySize() > 1 ? -1 : 0;
}